

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O0

void __thiscall
oout::SuiteTest::SuiteTest<oout::Test_const>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<const_oout::Test> *tests)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  shared_ptr<const_oout::Test> *local_a0;
  allocator<std::shared_ptr<const_oout::Test>_> local_69;
  shared_ptr<const_oout::Test> local_68;
  shared_ptr<const_oout::Test> local_58;
  shared_ptr<const_oout::Test> local_48;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_38;
  shared_ptr<const_oout::Test> *local_20;
  shared_ptr<const_oout::Test> *tests_local;
  shared_ptr<const_oout::Test> *test1_local;
  SuiteTest *this_local;
  
  local_20 = tests;
  tests_local = test1;
  test1_local = (shared_ptr<const_oout::Test> *)this;
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_68,test1);
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_58,local_20);
  local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_68;
  std::allocator<std::shared_ptr<const_oout::Test>_>::allocator(&local_69);
  __l._M_len = (size_type)
               local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_38,__l,&local_69);
  SuiteTest(this,&local_38);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_38);
  std::allocator<std::shared_ptr<const_oout::Test>_>::~allocator(&local_69);
  local_a0 = &local_48;
  do {
    local_a0 = local_a0 + -1;
    std::shared_ptr<const_oout::Test>::~shared_ptr(local_a0);
  } while (local_a0 != &local_68);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}